

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

const_iterator * __thiscall
Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
          (const_iterator *__return_storage_ptr__,Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *this
          )

{
  matrix_type *sparse_matrix;
  unsigned_long uVar1;
  
  sparse_matrix = this->matrix;
  uVar1 = (sparse_matrix->row_non_zero).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[this->row_index + 1];
  Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
            (__return_storage_ptr__,sparse_matrix,&this->row_index,
             (sparse_matrix->column_index).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar1,
             (sparse_matrix->element_value).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar1);
  return __return_storage_ptr__;
}

Assistant:

typename Matrix_Sparse_Row<_matrix_type>::const_iterator Matrix_Sparse_Row<_matrix_type>::end() const {
  const std::size_t& offset = matrix->row_non_zero[row_index + 1];
  return {matrix, row_index, &matrix->column_index[offset], &matrix->element_value[offset]};
}